

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O0

void __thiscall
KDIS::KException::KException<char_const*>
          (KException *this,KString *Text,KUINT16 EC,char *AdditonalInfo)

{
  ostream *poVar1;
  KUINT16 ErrorCode;
  string local_200 [32];
  KString local_1e0;
  stringstream local_1b0 [8];
  KStringStream ss;
  ostream local_1a0 [376];
  char *local_28;
  char *AdditonalInfo_local;
  KString *pKStack_18;
  KUINT16 EC_local;
  KString *Text_local;
  KException *this_local;
  
  local_28 = AdditonalInfo;
  AdditonalInfo_local._6_2_ = EC;
  pKStack_18 = Text;
  Text_local = (KString *)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__KException_0032eb48;
  this->m_ui16ErrorCode = AdditonalInfo_local._6_2_;
  std::__cxx11::string::string((string *)&this->m_sErrorText);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(string *)pKStack_18);
  poVar1 = std::operator<<(poVar1,": ");
  KDIS::GetErrorText_abi_cxx11_(&local_1e0,(KDIS *)(ulong)AdditonalInfo_local._6_2_,ErrorCode);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,(string *)&this->m_sErrorText);
  std::operator<<(poVar1,local_28);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }